

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboInvalidateTests.cpp
# Opt level: O1

deUint32 deqp::gles3::Functional::getCompatibleColorFormat(RenderTarget *renderTargetInfo)

{
  uint uVar1;
  
  uVar1 = (renderTargetInfo->m_pixelFormat).blueBits << 8 |
          (renderTargetInfo->m_pixelFormat).greenBits << 0x10 |
          (renderTargetInfo->m_pixelFormat).redBits << 0x18 |
          (renderTargetInfo->m_pixelFormat).alphaBits;
  if ((int)uVar1 < 0x5060500) {
    if (uVar1 == 0x4040404) {
      return 0x8056;
    }
    if (uVar1 == 0x5050501) {
      return 0x8057;
    }
  }
  else {
    if (uVar1 == 0x5060500) {
      return 0x8d62;
    }
    if (uVar1 == 0x8080808) {
      return 0x8058;
    }
    if (uVar1 == 0x8080800) {
      return 0x8051;
    }
  }
  return 0;
}

Assistant:

static deUint32 getCompatibleColorFormat (const tcu::RenderTarget& renderTargetInfo)
{
	const tcu::PixelFormat& pxFmt = renderTargetInfo.getPixelFormat();
	DE_ASSERT(de::inBounds(pxFmt.redBits,	0, 0xff) &&
			  de::inBounds(pxFmt.greenBits,	0, 0xff) &&
			  de::inBounds(pxFmt.blueBits,	0, 0xff) &&
			  de::inBounds(pxFmt.alphaBits,	0, 0xff));

#define PACK_FMT(R, G, B, A) (((R) << 24) | ((G) << 16) | ((B) << 8) | (A))

	// \note [pyry] This may not hold true on some implementations - best effort guess only.
	switch (PACK_FMT(pxFmt.redBits, pxFmt.greenBits, pxFmt.blueBits, pxFmt.alphaBits))
	{
		case PACK_FMT(8,8,8,8):		return GL_RGBA8;
		case PACK_FMT(8,8,8,0):		return GL_RGB8;
		case PACK_FMT(4,4,4,4):		return GL_RGBA4;
		case PACK_FMT(5,5,5,1):		return GL_RGB5_A1;
		case PACK_FMT(5,6,5,0):		return GL_RGB565;
		default:					return GL_NONE;
	}

#undef PACK_FMT
}